

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O1

string * __thiscall
Assimp::ColladaParser::ReadZaeManifest_abi_cxx11_
          (string *__return_storage_ptr__,ColladaParser *this,ZipArchiveIOSystem *zip_archive)

{
  pointer pcVar1;
  undefined8 uVar2;
  int iVar3;
  IOStream *_stream;
  CIrrXML_IOStreamReader *this_00;
  IrrXMLReader *pIVar4;
  undefined4 extraout_var;
  char *pcVar5;
  size_t sVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list;
  aiString ai_str;
  undefined1 local_458 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_438;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428 [63];
  undefined4 extraout_var_00;
  
  _stream = (IOStream *)
            (**(code **)((this->mFileName)._M_dataplus._M_p + 0x20))(this,"manifest.xml","rb");
  if (_stream == (IOStream *)0x0) {
    local_458._0_8_ = (pointer)0x0;
    local_458._8_8_ = (pointer)0x0;
    local_458._16_8_ = (pointer)0x0;
    local_438._M_allocated_capacity = (size_type)local_428;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_438,"dae","");
    ZipArchiveIOSystem::getFileListExtension
              ((ZipArchiveIOSystem *)this,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_458,(string *)&local_438);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_allocated_capacity != local_428) {
      operator_delete((void *)local_438._M_allocated_capacity,local_428[0]._M_allocated_capacity + 1
                     );
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if (local_458._0_8_ == local_458._8_8_) {
      __return_storage_ptr__->_M_string_length = 0;
      (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    }
    else {
      pcVar1 = ((_Alloc_hider *)local_458._0_8_)->_M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)__return_storage_ptr__,pcVar1,
                 pcVar1 + *(size_type *)(local_458._0_8_ + 8));
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_458);
    goto LAB_0042f32f;
  }
  this_00 = (CIrrXML_IOStreamReader *)operator_new(0x30);
  CIrrXML_IOStreamReader::CIrrXML_IOStreamReader(this_00,_stream);
  pIVar4 = irr::io::createIrrXMLReader((IFileReadCallBack *)this_00);
  do {
    do {
      iVar3 = (*pIVar4->_vptr_IIrrXMLReader[2])(pIVar4);
      if ((char)iVar3 == '\0') goto LAB_0042f26f;
      iVar3 = (*pIVar4->_vptr_IIrrXMLReader[3])(pIVar4);
    } while (iVar3 != 1);
    iVar3 = (*pIVar4->_vptr_IIrrXMLReader[0xd])(pIVar4);
    iVar3 = strcmp((char *)CONCAT44(extraout_var,iVar3),"dae_root");
  } while (iVar3 != 0);
  iVar3 = (*pIVar4->_vptr_IIrrXMLReader[2])(pIVar4);
  if ((char)iVar3 == '\0') {
LAB_0042f26f:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    iVar3 = (*pIVar4->_vptr_IIrrXMLReader[3])(pIVar4);
    if (iVar3 != 3) {
      iVar3 = (*pIVar4->_vptr_IIrrXMLReader[3])(pIVar4);
      if (iVar3 != 5) goto LAB_0042f26f;
    }
    iVar3 = (*pIVar4->_vptr_IIrrXMLReader[0xe])(pIVar4);
    pcVar5 = (char *)CONCAT44(extraout_var_00,iVar3);
    if (pcVar5 == (char *)0x0) goto LAB_0042f26f;
    local_458._0_8_ = local_458 + 0x10;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_458,pcVar5,pcVar5 + sVar6);
    uVar2 = local_458._0_8_;
    sVar6 = 0x3ff;
    if ((local_458._8_8_ & 0xfffffc00) == 0) {
      sVar6 = local_458._8_8_ & 0xffffffff;
    }
    local_438._M_allocated_capacity._0_4_ = (int)sVar6;
    memcpy(local_438._M_local_buf + 4,(void *)local_458._0_8_,sVar6);
    local_438._M_local_buf[sVar6 + 4] = '\0';
    if ((pointer)uVar2 != (pointer)(local_458 + 0x10)) {
      operator_delete((void *)uVar2,(ulong)((long)&((_Alloc_hider *)local_458._16_8_)->_M_p + 1));
    }
    UriDecodePath((aiString *)&local_438);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar5 = local_438._M_local_buf + 4;
    sVar6 = strlen(pcVar5);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,pcVar5,pcVar5 + sVar6);
  }
  (*pIVar4->_vptr_IIrrXMLReader[1])(pIVar4);
  (*(this_00->super_IFileReadCallBack)._vptr_IFileReadCallBack[1])(this_00);
LAB_0042f32f:
  if (_stream != (IOStream *)0x0) {
    (*_stream->_vptr_IOStream[1])(_stream);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ColladaParser::ReadZaeManifest(ZipArchiveIOSystem &zip_archive) {
    // Open the manifest
    std::unique_ptr<IOStream> manifestfile(zip_archive.Open("manifest.xml"));
    if (manifestfile == nullptr)
    {
        // No manifest, hope there is only one .DAE inside
        std::vector<std::string> file_list;
        zip_archive.getFileListExtension(file_list, "dae");

        if (file_list.empty())
            return std::string();

        return file_list.front();
    }

    std::unique_ptr<CIrrXML_IOStreamReader> mIOWrapper(new CIrrXML_IOStreamReader(manifestfile.get()));
    std::unique_ptr<irr::io::IrrXMLReader> manifest_reader(irr::io::createIrrXMLReader(mIOWrapper.get()));

    while (manifest_reader->read())
    {
        // find the manifest "dae_root" element
        if (manifest_reader->getNodeType() == irr::io::EXN_ELEMENT)
        {
            if (::strcmp(manifest_reader->getNodeName(), "dae_root") == 0)
            {
                if (!manifest_reader->read())
                    return std::string();
                if (manifest_reader->getNodeType() != irr::io::EXN_TEXT && manifest_reader->getNodeType() != irr::io::EXN_CDATA)
                    return std::string();

                const char* filepath = manifest_reader->getNodeData();
                if (filepath == nullptr)
                    return std::string();

                aiString ai_str(filepath);
                UriDecodePath(ai_str);

                return std::string(ai_str.C_Str());
            }
        }
    }
    return std::string();
}